

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_arrayreverse(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQOuter *pSVar3;
  ulong uVar4;
  SQObjectValue SVar5;
  long *plVar6;
  long lVar7;
  uint uVar8;
  SQDelegable *pSVar9;
  bool bVar10;
  SQObjectType SVar11;
  SQRESULT SVar12;
  SQObjectPtr *pSVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  SQObjectPtr t;
  SQObjectPtr *o;
  SQObjectPtr local_38;
  SQObjectPtr *local_28;
  
  if (v->_stackbase < v->_top) {
    bVar10 = sq_aux_gettypedarg(v,idx,OT_ARRAY,&local_28);
    SVar12 = -1;
    if (bVar10) {
      pSVar3 = (local_28->super_SQObject)._unVal.pOuter;
      uVar4 = pSVar3->_idx;
      if (0 < (long)uVar4) {
        local_38.super_SQObject._type = OT_NULL;
        local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
        if (uVar4 != 1) {
          uVar16 = uVar4 >> 1;
          lVar14 = 0;
          lVar15 = uVar4 << 4;
          do {
            pSVar13 = pSVar3->_valptr;
            SVar5 = (SQObjectValue)
                    ((SQObjectValue *)((long)&(pSVar13->super_SQObject)._unVal + lVar14))->pTable;
            SVar11 = *(SQObjectType *)((long)&(pSVar13->super_SQObject)._type + lVar14);
            if ((SVar11 >> 0x1b & 1) != 0) {
              pSVar1 = &((SVar5.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                        _uiRef;
              *pSVar1 = *pSVar1 + 1;
            }
            uVar8 = local_38.super_SQObject._type >> 0x1b;
            local_38.super_SQObject._type = SVar11;
            if ((uVar8 & 1) != 0) {
              pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).
                        super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 - 1;
              if (*pSVar1 == 0) {
                pSVar9 = &(local_38.super_SQObject._unVal.pTable)->super_SQDelegable;
                local_38.super_SQObject._unVal = SVar5;
                (*(pSVar9->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
                pSVar13 = pSVar3->_valptr;
                SVar11 = *(SQObjectType *)((long)&(pSVar13->super_SQObject)._type + lVar14);
                SVar5 = local_38.super_SQObject._unVal;
              }
            }
            local_38.super_SQObject._unVal = SVar5;
            plVar6 = *(long **)((long)&(pSVar13->super_SQObject)._unVal + lVar14);
            lVar7 = *(long *)((long)&pSVar13[-1].super_SQObject._unVal + lVar15);
            *(long *)((long)&(pSVar13->super_SQObject)._unVal + lVar14) = lVar7;
            uVar8 = *(uint *)((long)&pSVar13[-1].super_SQObject._type + lVar15);
            *(uint *)((long)&(pSVar13->super_SQObject)._type + lVar14) = uVar8;
            if ((uVar8 >> 0x1b & 1) != 0) {
              plVar2 = (long *)(lVar7 + 8);
              *plVar2 = *plVar2 + 1;
            }
            if ((SVar11 >> 0x1b & 1) != 0) {
              plVar2 = plVar6 + 1;
              *plVar2 = *plVar2 + -1;
              if (*plVar2 == 0) {
                (**(code **)(*plVar6 + 0x10))();
              }
            }
            pSVar13 = pSVar3->_valptr;
            uVar8 = *(uint *)((long)&pSVar13[-1].super_SQObject._type + lVar15);
            plVar6 = *(long **)((long)&pSVar13[-1].super_SQObject._unVal + lVar15);
            ((SQObjectValue *)((long)&pSVar13[-1].super_SQObject._unVal + lVar15))->pTable =
                 (SQTable *)local_38.super_SQObject._unVal;
            *(SQObjectType *)((long)&pSVar13[-1].super_SQObject._type + lVar15) =
                 local_38.super_SQObject._type;
            if ((local_38.super_SQObject._type >> 0x1b & 1) != 0) {
              pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).
                        super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 + 1;
            }
            if ((uVar8 >> 0x1b & 1) != 0) {
              plVar2 = plVar6 + 1;
              *plVar2 = *plVar2 + -1;
              if (*plVar2 == 0) {
                (**(code **)(*plVar6 + 0x10))();
              }
            }
            lVar14 = lVar14 + 0x10;
            uVar16 = uVar16 - 1;
            lVar15 = lVar15 + -0x10;
          } while (uVar16 != 0);
        }
        SQObjectPtr::~SQObjectPtr(&local_38);
      }
      SVar12 = 0;
    }
  }
  else {
    SQVM::Raise_Error(v,"not enough params in the stack");
    SVar12 = -1;
  }
  return SVar12;
}

Assistant:

SQRESULT sq_arrayreverse(HSQUIRRELVM v,SQInteger idx)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *o;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,o);
    SQArray *arr = _array(*o);
    if(arr->Size() > 0) {
        SQObjectPtr t;
        SQInteger size = arr->Size();
        SQInteger n = size >> 1; size -= 1;
        for(SQInteger i = 0; i < n; i++) {
            t = arr->_values[i];
            arr->_values[i] = arr->_values[size-i];
            arr->_values[size-i] = t;
        }
        return SQ_OK;
    }
    return SQ_OK;
}